

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

uint stb_vorbis_stream_length_in_samples(stb_vorbis *f)

{
  uint32 uVar1;
  uint32 uVar2;
  vorb *in_RDI;
  char header [6];
  uint32 hi;
  uint32 lo;
  uint last;
  uint last_page_loc;
  uint end;
  uint previous_safe;
  uint restore_offset;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  uint local_20;
  uint32 local_1c;
  uint local_4;
  
  if (in_RDI->push_mode == '\0') {
    if (in_RDI->total_samples == 0) {
      stb_vorbis_get_file_offset
                ((stb_vorbis *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      set_file_offset((stb_vorbis *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0)
      ;
      uVar1 = vorbis_find_page(_last_page_loc,_lo,stack0x00000008);
      if (uVar1 == 0) {
        in_RDI->error = VORBIS_cant_find_last_page;
        in_RDI->total_samples = 0xffffffff;
      }
      else {
        local_20 = stb_vorbis_get_file_offset
                             ((stb_vorbis *)
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        while (in_stack_ffffffffffffffdc == 0) {
          set_file_offset((stb_vorbis *)
                          CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
          uVar1 = vorbis_find_page(_last_page_loc,_lo,stack0x00000008);
          if (uVar1 == 0) break;
          local_20 = stb_vorbis_get_file_offset
                               ((stb_vorbis *)
                                CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        }
        set_file_offset((stb_vorbis *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                        0);
        getn((vorb *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             (uint8 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffcc);
        uVar1 = get32((vorb *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        uVar2 = get32((vorb *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        if ((uVar1 == 0xffffffff) && (uVar2 == 0xffffffff)) {
          in_RDI->error = VORBIS_cant_find_last_page;
          in_RDI->total_samples = 0xffffffff;
        }
        else {
          if (uVar2 != 0) {
            uVar1 = 0xfffffffe;
          }
          in_RDI->total_samples = uVar1;
          (in_RDI->p_last).page_start = local_20;
          (in_RDI->p_last).page_end = local_1c;
          (in_RDI->p_last).last_decoded_sample = uVar1;
        }
      }
      set_file_offset((stb_vorbis *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0)
      ;
    }
    if (in_RDI->total_samples == 0xffffffff) {
      local_4 = 0;
    }
    else {
      local_4 = in_RDI->total_samples;
    }
  }
  else {
    local_4 = error(in_RDI,VORBIS_invalid_api_mixing);
  }
  return local_4;
}

Assistant:

unsigned int stb_vorbis_stream_length_in_samples(stb_vorbis *f)
{
   unsigned int restore_offset, previous_safe;
   unsigned int end, last_page_loc;

   if (IS_PUSH_MODE(f)) return error(f, VORBIS_invalid_api_mixing);
   if (!f->total_samples) {
      unsigned int last;
      uint32 lo,hi;
      char header[6];

      // first, store the current decode position so we can restore it
      restore_offset = stb_vorbis_get_file_offset(f);

      // now we want to seek back 64K from the end (the last page must
      // be at most a little less than 64K, but let's allow a little slop)
      if (f->stream_len >= 65536 && f->stream_len-65536 >= f->first_audio_page_offset)
         previous_safe = f->stream_len - 65536;
      else
         previous_safe = f->first_audio_page_offset;

      set_file_offset(f, previous_safe);
      // previous_safe is now our candidate 'earliest known place that seeking
      // to will lead to the final page'

      if (!vorbis_find_page(f, &end, &last)) {
         // if we can't find a page, we're hosed!
         f->error = VORBIS_cant_find_last_page;
         f->total_samples = 0xffffffff;
         goto done;
      }

      // check if there are more pages
      last_page_loc = stb_vorbis_get_file_offset(f);

      // stop when the last_page flag is set, not when we reach eof;
      // this allows us to stop short of a 'file_section' end without
      // explicitly checking the length of the section
      while (!last) {
         set_file_offset(f, end);
         if (!vorbis_find_page(f, &end, &last)) {
            // the last page we found didn't have the 'last page' flag
            // set. whoops!
            break;
         }
         //previous_safe = last_page_loc+1; // NOTE: not used after this point, but note for debugging
         last_page_loc = stb_vorbis_get_file_offset(f);
      }

      set_file_offset(f, last_page_loc);

      // parse the header
      getn(f, (unsigned char *)header, 6);
      // extract the absolute granule position
      lo = get32(f);
      hi = get32(f);
      if (lo == 0xffffffff && hi == 0xffffffff) {
         f->error = VORBIS_cant_find_last_page;
         f->total_samples = SAMPLE_unknown;
         goto done;
      }
      if (hi)
         lo = 0xfffffffe; // saturate
      f->total_samples = lo;

      f->p_last.page_start = last_page_loc;
      f->p_last.page_end   = end;
      f->p_last.last_decoded_sample = lo;

     done:
      set_file_offset(f, restore_offset);
   }
   return f->total_samples == SAMPLE_unknown ? 0 : f->total_samples;
}